

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtis(fitsfile *fptr,char *grpname,int grouptype,int *status)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int hdunum;
  int hdutype;
  int tfields;
  char extname [9];
  char *ttype [6];
  char *tform [6];
  char keyvalue [71];
  char comment [73];
  char tformBuff [54];
  char keyword [75];
  char ttypeBuff [102];
  
  lVar3 = 0;
  tfields = 0;
  hdunum = 0;
  hdutype = 0;
  builtin_strncpy(extname,"GROUPING",9);
  pcVar4 = tformBuff;
  pcVar5 = ttypeBuff;
  do {
    ttype[lVar3] = pcVar5;
    tform[lVar3] = pcVar4;
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 9;
    pcVar5 = pcVar5 + 0x11;
  } while (lVar3 != 6);
  iVar1 = ffgtdc(grouptype,0,0,0,0,0,0,ttype,tform,&tfields,status);
  iVar2 = tfields;
  *status = iVar1;
  uVar8 = (ulong)(uint)tfields;
  iVar1 = ffibin(fptr,0,tfields,ttype,tform,(char **)0x0,(char *)0x0,0,status);
  *status = iVar1;
  if (iVar1 == 0) {
    ffghdn(fptr,&hdunum);
    ffgkey(fptr,"TFIELDS",keyvalue,comment,status);
    ffikys(fptr,"EXTNAME",extname,"HDU contains a Grouping Table",status);
    ffikyj(fptr,"EXTVER",0,"Grouping Table vers. (this file)",status);
    if ((grpname != (char *)0x0) && (*grpname != '\0')) {
      ffikys(fptr,"GRPNAME",grpname,"Grouping Table name",status);
    }
    if (0 < iVar2) {
      uVar6 = 0;
      do {
        if (*status != 0) break;
        iVar2 = fits_strcasecmp(ttype[uVar6],"MEMBER_POSITION");
        if (iVar2 == 0) {
LAB_0016cac9:
          uVar7 = (int)uVar6 + 1;
          snprintf(keyword,0x4b,"TFORM%d",(ulong)uVar7);
          iVar2 = ffgkys(fptr,keyword,keyvalue,comment,status);
          *status = iVar2;
          snprintf(keyword,0x4b,"TNULL%d",(ulong)uVar7);
          iVar2 = ffikyj(fptr,keyword,0,"Column Null Value",status);
          *status = iVar2;
        }
        else {
          iVar2 = fits_strcasecmp(ttype[uVar6],"MEMBER_VERSION");
          if (iVar2 == 0) goto LAB_0016cac9;
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    lVar3 = 0;
    do {
      lVar3 = lVar3 + 1;
      iVar2 = ffmnhd(fptr,-1,"GROUPING",(int)lVar3,status);
    } while (iVar2 == 0);
    if (*status == 0x12d) {
      *status = 0;
    }
    ffmahd(fptr,hdunum,&hdutype,status);
    ffmkyj(fptr,"EXTVER",lVar3,"&",status);
  }
  return *status;
}

Assistant:

int ffgtis(fitsfile *fptr,      /* FITS file pointer                         */
	   char    *grpname,    /* name of the grouping table                */
	   int      grouptype,  /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */
	   
/* 
   insert a grouping table just after the current HDU of the current FITS file.
   This is the same as fits_create_group() only it allows the user to select
   the place within the FITS file to add the grouping table.
*/

{

  int tfields  = 0;
  int hdunum   = 0;
  int hdutype  = 0;
  int extver;
  int i;
  
  long pcount  = 0;

  char *ttype[6];
  char *tform[6];

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  extname[] = "GROUPING";
  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];
    
  do
    {

      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* define the columns required according to the grouptype parameter */

      *status = ffgtdc(grouptype,0,0,0,0,0,0,ttype,tform,&tfields,status);

      /* create the grouping table using the columns defined above */

      *status = fits_insert_btbl(fptr,0,tfields,ttype,tform,NULL,
				 NULL,pcount,status);

      if(*status != 0) continue;

      /*
	 retrieve the hdu position of the new grouping table for
	 future use
      */

      fits_get_hdu_num(fptr,&hdunum);

      /*
	 add the EXTNAME and EXTVER keywords to the HDU just after the 
	 TFIELDS keyword; for now the EXTVER value is set to 0, it will be 
	 set to the correct value later on
      */

      fits_read_keyword(fptr,"TFIELDS",keyvalue,comment,status);

      fits_insert_key_str(fptr,"EXTNAME",extname,
			  "HDU contains a Grouping Table",status);
      fits_insert_key_lng(fptr,"EXTVER",0,"Grouping Table vers. (this file)",
			  status);

      /* 
	 if the grpname parameter value was defined (Non NULL and non zero
	 length) then add the GRPNAME keyword and value
      */

      if(grpname != NULL && strlen(grpname) > 0)
	fits_insert_key_str(fptr,"GRPNAME",grpname,"Grouping Table name",
			    status);

      /* 
	 add the TNULL keywords and values for each integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns.
      */

      for(i = 0; i < tfields && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",i+1);
	      *status = fits_read_key_str(fptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",i+1);

	      *status = fits_insert_key_lng(fptr,keyword,0,"Column Null Value",
					    status);
	    }
	}

      /*
	 determine the correct EXTVER value for the new grouping table
	 by finding the highest numbered grouping table EXTVER value
	 the currently exists
      */

      for(extver = 1;
	  (fits_movnam_hdu(fptr,ANY_HDU,"GROUPING",extver,status)) == 0; 
	  ++extver);

      if(*status == BAD_HDU_NUM) *status = 0;

      /*
	 move back to the new grouping table HDU and update the EXTVER
	 keyword value
      */

      fits_movabs_hdu(fptr,hdunum,&hdutype,status);

      fits_modify_key_lng(fptr,"EXTVER",extver,"&",status);

    }while(0);


  return(*status);
}